

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

int xmlBufAddLen(xmlBufPtr buf,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  
  if ((buf != (xmlBufPtr)0x0) && ((buf->flags & 7) == 0)) {
    uVar2 = (ulong)buf->compat_size;
    uVar1 = buf->size;
    if (buf->size != uVar2 && uVar2 < 0x7fffffff) {
      buf->size = uVar2;
      uVar1 = uVar2;
    }
    uVar2 = (ulong)buf->compat_use;
    sVar3 = buf->use;
    if (buf->use != uVar2 && uVar2 < 0x7fffffff) {
      buf->use = uVar2;
      sVar3 = uVar2;
    }
    if (len <= uVar1 - sVar3) {
      buf->use = sVar3 + len;
      buf->content[sVar3 + len] = '\0';
      uVar1 = buf->size;
      if (0x7ffffffe < uVar1) {
        uVar1 = 0x7fffffff;
      }
      buf->compat_size = (uint)uVar1;
      uVar1 = 0x7fffffff;
      if (buf->use < 0x7fffffff) {
        uVar1 = buf->use;
      }
      buf->compat_use = (uint)uVar1;
      return 0;
    }
  }
  return -1;
}

Assistant:

int
xmlBufAddLen(xmlBufPtr buf, size_t len) {
    if ((buf == NULL) || (BUF_ERROR(buf)) || (BUF_STATIC(buf)))
        return(-1);
    CHECK_COMPAT(buf)
    if (len > buf->size - buf->use)
        return(-1);
    buf->use += len;
    buf->content[buf->use] = 0;
    UPDATE_COMPAT(buf)
    return(0);
}